

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testCurrentProgPriority
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  size_t *__return_storage_ptr__;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  data;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_00;
  bool condition;
  deBool dVar1;
  GLuint GVar2;
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *this_00;
  Pipeline *this_01;
  ProgramPipeline *this_02;
  ProgramWrapper *pPVar3;
  TestLog *log;
  TestLog *this_03;
  SeparateShaderTest *pSVar4;
  double __x;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined8 in_stack_fffffffffffffd70;
  allocator<char> *__a;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  LogImage local_1b0;
  allocator<char> local_119;
  string local_118;
  RGBA local_f4;
  byte local_ed;
  deUint32 local_ec;
  undefined1 local_e8 [3];
  bool result;
  deUint32 drawSeed;
  Surface resultSurface;
  Surface refSurface;
  Surface pipelineSurface;
  undefined1 local_80 [8];
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  program;
  GLuint pipeName;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  local_60;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *local_50;
  Pipeline *local_40;
  Pipeline *pipeline;
  ProgramParams programPp;
  ProgramParams pipePp;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *pipeOut_local;
  SeparateShaderTest *this_local;
  
  join_0x00000010_0x00000000_ = genProgramParams(&this->m_rnd);
  _pipeline = genProgramParams(&this->m_rnd);
  pSVar4 = this;
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)&local_60,this,(ProgramParams *)&programPp.frgSeed);
  local_50 = de::details::MovePtr::operator_cast_to_PtrData(&local_60,(MovePtr *)pSVar4);
  data.ptr._4_4_ = in_stack_fffffffffffffd6c;
  data.ptr._0_4_ = in_stack_fffffffffffffd68;
  data._8_8_ = in_stack_fffffffffffffd70;
  this_00 = &de::details::
             MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
             ::operator=(pipeOut,data)->
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ;
  this_01 = de::details::
            UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
            ::operator*(this_00);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
              *)&local_60);
  local_40 = this_01;
  this_02 = de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
            ::operator->((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                          *)this_01);
  program.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data._8_4_ = glu::ProgramPipeline::getPipeline(this_02);
  __return_storage_ptr__ = &pipelineSurface.m_pixels.m_cap;
  pSVar4 = this;
  createReferenceProgram
            ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)__return_storage_ptr__,this,(ProgramParams *)&pipeline);
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)__return_storage_ptr__,(MovePtr *)pSVar4);
  data_00.ptr._4_4_ = in_stack_fffffffffffffd6c;
  data_00.ptr._0_4_ = in_stack_fffffffffffffd68;
  data_00._8_8_ = in_stack_fffffffffffffd70;
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::UniquePtr((UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               *)local_80,data_00);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)&pipelineSurface.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)&refSurface.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)&resultSurface.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_e8);
  local_ec = de::Random::getUint32(&this->m_rnd);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    glu::CallLogWrapper::glBindProgramPipeline
              (&this->super_CallLogWrapper,
               program.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               .m_data._8_4_);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  drawSurface(this,(Surface *)&refSurface.m_pixels.m_cap,local_ec);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    glu::CallLogWrapper::glBindProgramPipeline(&this->super_CallLogWrapper,0);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    pPVar3 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)local_80);
    GVar2 = (*pPVar3->_vptr_ProgramWrapper[2])();
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  drawSurface(this,(Surface *)&resultSurface.m_pixels.m_cap,local_ec);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,0);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    pPVar3 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)local_80);
    GVar2 = (*pPVar3->_vptr_ProgramWrapper[2])();
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    glu::CallLogWrapper::glBindProgramPipeline
              (&this->super_CallLogWrapper,
               program.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               .m_data._8_4_);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  drawSurface(this,(Surface *)local_e8,local_ec);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    glu::CallLogWrapper::glBindProgramPipeline(&this->super_CallLogWrapper,0);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,0);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::RGBA::RGBA(&local_f4,0,0,0,0);
  condition = tcu::pixelThresholdCompare
                        (log,"Active program rendering result","Active program rendering result",
                         (Surface *)&resultSurface.m_pixels.m_cap,(Surface *)local_e8,&local_f4,
                         COMPARE_LOG_RESULT);
  local_ed = condition;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"glBindProgramPipeline() affects glUseProgram()",&local_119);
  tcu::ResultCollector::check(&this->m_status,condition,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  __x = (double)std::allocator<char>::~allocator(&local_119);
  if ((local_ed & 1) == 0) {
    SeparateShaderTest::log(this,__x);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"Pipeline image",&local_1d1);
    __a = &local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"Image produced by pipeline",__a);
    tcu::LogImage::LogImage
              (&local_1b0,&local_1d0,&local_1f8,(Surface *)&refSurface.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(this_03,&local_1b0);
    tcu::LogImage::~LogImage(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
  }
  tcu::Surface::~Surface((Surface *)local_e8);
  tcu::Surface::~Surface((Surface *)&resultSurface.m_pixels.m_cap);
  tcu::Surface::~Surface((Surface *)&refSurface.m_pixels.m_cap);
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniquePtr((UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_80);
  return;
}

Assistant:

void SeparateShaderTest::testCurrentProgPriority (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pipePp		= genProgramParams(m_rnd);
	ProgramParams				programPp	= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pipePp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	UniquePtr<ProgramWrapper>	program		(createReferenceProgram(programPp));
	Surface						pipelineSurface;
	Surface						refSurface;
	Surface						resultSurface;
	deUint32					drawSeed	= m_rnd.getUint32();

	LOG_CALL(glBindProgramPipeline(pipeName));
	drawSurface(pipelineSurface, drawSeed);
	LOG_CALL(glBindProgramPipeline(0));

	LOG_CALL(glUseProgram(program->getProgramName()));
	drawSurface(refSurface, drawSeed);
	LOG_CALL(glUseProgram(0));

	LOG_CALL(glUseProgram(program->getProgramName()));
	LOG_CALL(glBindProgramPipeline(pipeName));
	drawSurface(resultSurface, drawSeed);
	LOG_CALL(glBindProgramPipeline(0));
	LOG_CALL(glUseProgram(0));

	bool result = tcu::pixelThresholdCompare(
		m_testCtx.getLog(), "Active program rendering result",
		"Active program rendering result",
		refSurface, resultSurface, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	m_status.check(result, "glBindProgramPipeline() affects glUseProgram()");
	if (!result)
		log() << TestLog::Image("Pipeline image", "Image produced by pipeline",
								pipelineSurface);
}